

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_test.cc
# Opt level: O2

void intgemm::kernel_relu_test<(intgemm::CPUType)4,signed_char>(void)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  undefined1 auVar5 [64];
  uint local_12c;
  AlignedVector<signed_char> input;
  AlignedVector<signed_char> output;
  SourceLineInfo local_108;
  StringRef local_f8;
  undefined1 local_e8 [64];
  BinaryExpr<const_signed_char_&,_const_int_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (3 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&input,0x40,0x40);
    AlignedVector<signed_char>::AlignedVector(&output,0x40,0x40);
    for (sVar3 = 0; input.size_ != sVar3; sVar3 = sVar3 + 1) {
      input.mem_[sVar3] = (char)sVar3 + -0x20;
    }
    auVar5 = vmovdqa64_avx512f(*(undefined1 (*) [64])input.mem_);
    if (kernels::relu<signed_char>(intgemm::vector_s<(intgemm::CPUType)4,signed_char>::type)::
        vconst_zero == '\0') {
      local_e8 = vmovdqu64_avx512f(auVar5);
      iVar2 = __cxa_guard_acquire(&kernels::
                                   relu<signed_char>(intgemm::vector_s<(intgemm::CPUType)4,signed_char>::type)
                                   ::vconst_zero);
      auVar5 = vmovdqu64_avx512f(local_e8);
      if (iVar2 != 0) {
        kernels::relu<signed_char>(intgemm::vector_s<(intgemm::CPUType)4,signed_char>::type)::
        vconst_zero = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
        __cxa_guard_release(&kernels::
                             relu<signed_char>(intgemm::vector_s<(intgemm::CPUType)4,signed_char>::type)
                             ::vconst_zero);
        auVar5 = vmovdqu64_avx512f(local_e8);
      }
    }
    auVar5 = vpmaxsb_avx512bw(auVar5,kernels::
                                     relu<signed_char>(intgemm::vector_s<(intgemm::CPUType)4,signed_char>::type)
                                     ::vconst_zero);
    auVar5 = vmovdqa64_avx512f(auVar5);
    *(undefined1 (*) [64])output.mem_ = auVar5;
    for (uVar4 = 0; uVar4 < output.size_; uVar4 = uVar4 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_108.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/relu_test.cc"
      ;
      local_108.line = 0x19;
      Catch::StringRef::StringRef(&local_f8,"output[i] == (input[i] < 0 ? 0 : input[i])");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_108,local_f8,ContinueOnFailure
                );
      local_108.file = output.mem_ + uVar4;
      bVar1 = input.mem_[uVar4];
      if (input.mem_[uVar4] < '\x01') {
        bVar1 = 0;
      }
      local_12c = (uint)bVar1;
      Catch::ExprLhs<signed_char_const&>::operator==
                (&local_a8,(ExprLhs<signed_char_const&> *)&local_108,(int *)&local_12c);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    free(output.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_relu_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr int VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(-VECTOR_LENGTH / 2));

  *output.template as<vec_t>() = kernels::relu<ElemType_>(*input.template as<vec_t>());
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == (input[i] < 0 ? 0 : input[i]));
}